

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pedigrees.c
# Opt level: O1

void load_pedigree_leaf_into_user_worker(__cilkrts_worker *w)

{
  __cilkrts_pedigree *p_Var1;
  __cilkrts_pedigree *p_Var2;
  
  if (w->l->type == WORKER_USER) {
    p_Var2 = __cilkrts_get_tls_pedigree_leaf(1);
    p_Var1 = p_Var2->parent;
    (w->pedigree).rank = p_Var2->rank;
    (w->pedigree).parent = p_Var1;
    if (w->l->original_pedigree_leaf != (__cilkrts_pedigree *)0x0) goto LAB_0010bf78;
    w->l->original_pedigree_leaf = p_Var2;
    __cilkrts_set_tls_pedigree_leaf(&w->pedigree);
    p_Var1 = (w->pedigree).parent;
    if (p_Var1 != (__cilkrts_pedigree *)0x0) {
      if (p_Var1->parent == (__cilkrts_pedigree *)0x0) {
        return;
      }
      goto LAB_0010bf82;
    }
  }
  else {
    load_pedigree_leaf_into_user_worker_cold_1();
LAB_0010bf78:
    load_pedigree_leaf_into_user_worker_cold_2();
  }
  load_pedigree_leaf_into_user_worker_cold_4();
LAB_0010bf82:
  load_pedigree_leaf_into_user_worker_cold_3();
}

Assistant:

void load_pedigree_leaf_into_user_worker(__cilkrts_worker *w)
{
    __cilkrts_pedigree *pedigree_leaf;
    CILK_ASSERT(w->l->type == WORKER_USER);
    pedigree_leaf = __cilkrts_get_tls_pedigree_leaf(1);
    w->pedigree = *pedigree_leaf;

    // Save a pointer to the old leaf.
    // We'll need to restore it later.
    CILK_ASSERT(w->l->original_pedigree_leaf == NULL);
    w->l->original_pedigree_leaf = pedigree_leaf;
    
    __cilkrts_set_tls_pedigree_leaf(&w->pedigree);
    
    // Check that this new pedigree root has at least two values.
    CILK_ASSERT(w->pedigree.parent);
    CILK_ASSERT(w->pedigree.parent->parent == NULL);
}